

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall rcg::System::System(System *this,string *_filename)

{
  shared_ptr<const_rcg::GenTLWrapper> *this_00;
  GC_ERROR GVar1;
  GenTLWrapper *this_01;
  GenTLException *this_02;
  allocator local_49;
  string local_48;
  
  (this->super_enable_shared_from_this<rcg::System>)._M_weak_this.
  super___weak_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<rcg::System>)._M_weak_this.
  super___weak_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(this->mtx).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mtx).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->mtx).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->mtx).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ilist).
  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ilist).
  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ilist).
  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&this->filename);
  this_01 = (GenTLWrapper *)operator_new(0x1d0);
  GenTLWrapper::GenTLWrapper(this_01,&this->filename);
  std::__shared_ptr<rcg::GenTLWrapper_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<rcg::GenTLWrapper,void>
            ((__shared_ptr<rcg::GenTLWrapper_const,(__gnu_cxx::_Lock_policy)2> *)&local_48,this_01);
  this_00 = &this->gentl;
  std::__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  GVar1 = (*((this_00->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->GCInitLib)();
  if (GVar1 == 0) {
    this->n_open = 0;
    this->tl = (void *)0x0;
    return;
  }
  this_02 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_48,"System::System()",&local_49);
  GenTLException::GenTLException(this_02,&local_48,this_00);
  __cxa_throw(this_02,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

System::System(const std::string &_filename)
{
  filename=_filename;

  gentl=std::shared_ptr<const GenTLWrapper>(new GenTLWrapper(filename));

  if (gentl->GCInitLib() != GenTL::GC_ERR_SUCCESS)
  {
    throw GenTLException("System::System()", gentl);
  }

  n_open=0;
  tl=0;
}